

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O3

bool_t prf_material_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  uint len;
  uint uVar5;
  float32_t fVar6;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 != prf_material_info.opcode) {
    prf_error(9,"tried to use material load method on node of type %d.",(ulong)uVar1);
    uVar5 = 2;
LAB_0010a951:
    bf_rewind(bfile,uVar5);
    return 0;
  }
  uVar2 = bf_get_uint16_be(bfile);
  node->length = uVar2;
  puVar4 = (uint32_t *)node->data;
  if (puVar4 == (uint32_t *)0x0) {
    uVar5 = 4;
    if (uVar2 < 5) goto LAB_0010a980;
    pool_id = state->model->mempool_id;
    if (pool_id == 0) {
      puVar4 = (uint32_t *)malloc((ulong)(uVar2 - 4));
    }
    else {
      puVar4 = (uint32_t *)pool_malloc(pool_id,uVar2 - 4);
    }
    node->data = (uint8_t *)puVar4;
    if (puVar4 == (uint32_t *)0x0) {
      prf_error(9,"memory allocation problem (returned NULL)");
      uVar5 = 4;
      goto LAB_0010a951;
    }
    uVar2 = node->length;
  }
  uVar5 = 4;
  if (7 < uVar2) {
    uVar3 = bf_get_uint32_be(bfile);
    *puVar4 = uVar3;
    uVar2 = node->length;
    uVar5 = 8;
    if (0x13 < uVar2) {
      bf_read(bfile,(uint8_t *)(puVar4 + 1),0xc);
      uVar2 = node->length;
      uVar5 = 0x14;
      if (0x17 < uVar2) {
        uVar3 = bf_get_uint32_be(bfile);
        puVar4[4] = uVar3;
        uVar2 = node->length;
        uVar5 = 0x18;
        if (0x1b < uVar2) {
          fVar6 = bf_get_float32_be(bfile);
          puVar4[5] = (uint32_t)fVar6;
          uVar2 = node->length;
          uVar5 = 0x1c;
          if (0x1f < uVar2) {
            fVar6 = bf_get_float32_be(bfile);
            puVar4[6] = (uint32_t)fVar6;
            uVar2 = node->length;
            uVar5 = 0x20;
            if (0x23 < uVar2) {
              fVar6 = bf_get_float32_be(bfile);
              puVar4[7] = (uint32_t)fVar6;
              uVar2 = node->length;
              uVar5 = 0x24;
              if (0x27 < uVar2) {
                fVar6 = bf_get_float32_be(bfile);
                puVar4[8] = (uint32_t)fVar6;
                uVar2 = node->length;
                uVar5 = 0x28;
                if (0x2b < uVar2) {
                  fVar6 = bf_get_float32_be(bfile);
                  puVar4[9] = (uint32_t)fVar6;
                  uVar2 = node->length;
                  uVar5 = 0x2c;
                  if (0x2f < uVar2) {
                    fVar6 = bf_get_float32_be(bfile);
                    puVar4[10] = (uint32_t)fVar6;
                    uVar2 = node->length;
                    uVar5 = 0x30;
                    if (0x33 < uVar2) {
                      fVar6 = bf_get_float32_be(bfile);
                      puVar4[0xb] = (uint32_t)fVar6;
                      uVar2 = node->length;
                      uVar5 = 0x34;
                      if (0x37 < uVar2) {
                        fVar6 = bf_get_float32_be(bfile);
                        puVar4[0xc] = (uint32_t)fVar6;
                        uVar2 = node->length;
                        uVar5 = 0x38;
                        if (0x3b < uVar2) {
                          fVar6 = bf_get_float32_be(bfile);
                          puVar4[0xd] = (uint32_t)fVar6;
                          uVar2 = node->length;
                          uVar5 = 0x3c;
                          if (0x3f < uVar2) {
                            fVar6 = bf_get_float32_be(bfile);
                            puVar4[0xe] = (uint32_t)fVar6;
                            uVar2 = node->length;
                            uVar5 = 0x40;
                            if (0x43 < uVar2) {
                              fVar6 = bf_get_float32_be(bfile);
                              puVar4[0xf] = (uint32_t)fVar6;
                              uVar2 = node->length;
                              uVar5 = 0x44;
                              if (0x47 < uVar2) {
                                fVar6 = bf_get_float32_be(bfile);
                                puVar4[0x10] = (uint32_t)fVar6;
                                uVar2 = node->length;
                                uVar5 = 0x48;
                                if (0x4b < uVar2) {
                                  fVar6 = bf_get_float32_be(bfile);
                                  puVar4[0x11] = (uint32_t)fVar6;
                                  uVar2 = node->length;
                                  uVar5 = 0x4c;
                                  if (0x4f < uVar2) {
                                    fVar6 = bf_get_float32_be(bfile);
                                    puVar4[0x12] = (uint32_t)fVar6;
                                    uVar2 = node->length;
                                    uVar5 = 0x50;
                                    if (0x53 < uVar2) {
                                      uVar3 = bf_get_uint32_be(bfile);
                                      puVar4[0x13] = uVar3;
                                      uVar2 = node->length;
                                      uVar5 = 0x54;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010a980:
  len = uVar2 - uVar5;
  if (uVar5 <= uVar2 && len != 0) {
    bf_read(bfile,node->data + ((ulong)uVar5 - 4),len);
  }
  return 1;
}

Assistant:

static
bool_t
prf_material_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "tried to use material load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 4) ) break;
        data->material_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->spare = bf_get_uint32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}